

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O0

void __thiscall EhFrame::CIE::Begin(CIE *this)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  undefined4 *puVar4;
  LEB128Wrapper<int> LStack_24;
  ubyte returnAddressRegister;
  int local_20;
  LEB128 dataAlignmentFactor;
  ULEB128 codeAlignmentFactor;
  ubyte augmentationString;
  ubyte version;
  uword cie_id;
  CIE *this_local;
  
  sVar3 = Writer::Count((this->super_Entry).writer);
  if (sVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EhFrame.cpp"
                       ,0x9f,"(writer->Count() == 0)","writer->Count() == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  EhFrame::Entry::Begin(&this->super_Entry);
  EhFrame::Entry::Emit(&this->super_Entry,0);
  EhFrame::Entry::Emit(&this->super_Entry,'\x01');
  EhFrame::Entry::Emit(&this->super_Entry,'\0');
  LEB128Wrapper<unsigned_int>::LEB128Wrapper((LEB128Wrapper<unsigned_int> *)&dataAlignmentFactor,1);
  local_20 = dataAlignmentFactor.value;
  EhFrame::Entry::Emit(&this->super_Entry,(ULEB128)dataAlignmentFactor.value);
  LEB128Wrapper<int>::LEB128Wrapper(&stack0xffffffffffffffdc,-8);
  EhFrame::Entry::Emit(&this->super_Entry,(LEB128)LStack_24.value);
  EhFrame::Entry::Emit(&this->super_Entry,'\x10');
  return;
}

Assistant:

void EhFrame::CIE::Begin()
{
    Assert(writer->Count() == 0);
    Entry::Begin();

    const uword cie_id = 0;
    Emit(cie_id);

    const ubyte version = 1;
    Emit(version);

    const ubyte augmentationString = 0; // none
    Emit(augmentationString);

    const ULEB128 codeAlignmentFactor = 1;
    Emit(codeAlignmentFactor);

    const LEB128 dataAlignmentFactor = - MachPtr;
    Emit(dataAlignmentFactor);

    const ubyte returnAddressRegister = DWARF_RegRA;
    Emit(returnAddressRegister);
}